

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockContextQueueDock
               (ImGuiContext_conflict1 *ctx,ImGuiWindow_conflict *target,ImGuiDockNode *target_node,
               ImGuiWindow_conflict *payload,ImGuiDir split_dir,float split_ratio,bool split_outer)

{
  int *piVar1;
  ImVector<ImGuiDockRequest> *pIVar2;
  int iVar3;
  ImGuiDockRequest *pIVar4;
  ImGuiDockRequest *__dest;
  int iVar5;
  int iVar6;
  uint7 uStack_47;
  
  if (target != payload) {
    iVar6 = (ctx->DockContext).Requests.Size;
    iVar3 = (ctx->DockContext).Requests.Capacity;
    if (iVar6 == iVar3) {
      iVar6 = iVar6 + 1;
      if (iVar3 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar3 / 2 + iVar3;
      }
      if (iVar6 < iVar5) {
        iVar6 = iVar5;
      }
      if (iVar3 < iVar6) {
        if (GImGui != (ImGuiContext_conflict1 *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiDockRequest *)(*GImAllocatorAllocFunc)((long)iVar6 << 6,GImAllocatorUserData)
        ;
        pIVar4 = (ctx->DockContext).Requests.Data;
        if (pIVar4 != (ImGuiDockRequest *)0x0) {
          memcpy(__dest,pIVar4,(long)(ctx->DockContext).Requests.Size << 6);
          pIVar4 = (ctx->DockContext).Requests.Data;
          if ((pIVar4 != (ImGuiDockRequest *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
        }
        (ctx->DockContext).Requests.Data = __dest;
        (ctx->DockContext).Requests.Capacity = iVar6;
      }
    }
    pIVar4 = (ctx->DockContext).Requests.Data;
    iVar6 = (ctx->DockContext).Requests.Size;
    pIVar4[iVar6].Type = ImGuiDockRequestType_Dock;
    pIVar4[iVar6].DockTargetWindow = target;
    pIVar4[iVar6].DockTargetNode = target_node;
    pIVar4[iVar6].DockPayload = payload;
    pIVar4[iVar6].DockSplitDir = split_dir;
    pIVar4[iVar6].DockSplitRatio = split_ratio;
    pIVar4[iVar6].DockSplitOuter = split_outer;
    *(ulong *)&pIVar4[iVar6].field_0x29 = (ulong)uStack_47;
    *(undefined8 *)(&pIVar4[iVar6].field_0x29 + 8) = 0;
    pIVar4[iVar6].UndockTargetNode = (ImGuiDockNode *)0x0;
    pIVar2 = &(ctx->DockContext).Requests;
    pIVar2->Size = pIVar2->Size + 1;
    return;
  }
  __assert_fail("target != payload",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x336c,
                "void ImGui::DockContextQueueDock(ImGuiContext *, ImGuiWindow *, ImGuiDockNode *, ImGuiWindow *, ImGuiDir, float, bool)"
               );
}

Assistant:

void ImGui::DockContextQueueDock(ImGuiContext* ctx, ImGuiWindow* target, ImGuiDockNode* target_node, ImGuiWindow* payload, ImGuiDir split_dir, float split_ratio, bool split_outer)
{
    IM_ASSERT(target != payload);
    ImGuiDockRequest req;
    req.Type = ImGuiDockRequestType_Dock;
    req.DockTargetWindow = target;
    req.DockTargetNode = target_node;
    req.DockPayload = payload;
    req.DockSplitDir = split_dir;
    req.DockSplitRatio = split_ratio;
    req.DockSplitOuter = split_outer;
    ctx->DockContext.Requests.push_back(req);
}